

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.h
# Opt level: O0

void __thiscall FResourceLump::FResourceLump(FResourceLump *this)

{
  FResourceLump *this_local;
  
  this->_vptr_FResourceLump = (_func_int **)&PTR__FResourceLump_00b872c0;
  FString::FString(&this->FullName);
  this->Cache = (char *)0x0;
  this->Owner = (FResourceFile *)0x0;
  this->Flags = '\0';
  this->RefCount = '\0';
  this->Namespace = 0;
  (this->field_3).Name[0] = '\0';
  this->LinkedTexture = (FTexture *)0x0;
  return;
}

Assistant:

FResourceLump()
	{
		Cache = NULL;
		Owner = NULL;
		Flags = 0;
		RefCount = 0;
		Namespace = 0;	// ns_global
		*Name = 0;
		LinkedTexture = NULL;
	}